

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mipmapped_texture::swap(mipmapped_texture *this,mipmapped_texture *img)

{
  mipmapped_texture *img_local;
  mipmapped_texture *this_local;
  
  std::swap<unsigned_int>(&this->m_width,&img->m_width);
  std::swap<unsigned_int>(&this->m_height,&img->m_height);
  std::swap<crnlib::pixel_format_helpers::component_flags>(&this->m_comp_flags,&img->m_comp_flags);
  std::swap<crnlib::pixel_format>(&this->m_format,&img->m_format);
  vector<crnlib::vector<crnlib::mip_level_*>_>::swap(&this->m_faces,&img->m_faces);
  dynamic_string::swap(&this->m_last_error,&img->m_last_error);
  std::swap<crnlib::texture_file_types::format>(&this->m_source_file_type,&img->m_source_file_type);
  return;
}

Assistant:

void mipmapped_texture::swap(mipmapped_texture& img) {
    std::swap(m_width, img.m_width);
    std::swap(m_height, img.m_height);
    std::swap(m_comp_flags, img.m_comp_flags);
    std::swap(m_format, img.m_format);
  m_faces.swap(img.m_faces);
  m_last_error.swap(img.m_last_error);
  std::swap(m_source_file_type, img.m_source_file_type);

  CRNLIB_ASSERT(check());
}